

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O0

int fieldargs(lua_State *L,int farg,int *width)

{
  lua_Integer lVar1;
  lua_Integer lVar2;
  lua_Integer w;
  lua_Integer f;
  int *width_local;
  int farg_local;
  lua_State *L_local;
  
  lVar1 = luaL_checkinteger(L,farg);
  lVar2 = luaL_optinteger(L,farg + 1,1);
  if (lVar1 < 0) {
    luaL_argerror(L,farg,"field cannot be negative");
  }
  if (lVar2 < 1) {
    luaL_argerror(L,farg + 1,"width must be positive");
  }
  if (0x20 < lVar1 + lVar2) {
    luaL_error(L,"trying to access non-existent bits");
  }
  *width = (int)lVar2;
  return (int)lVar1;
}

Assistant:

static int fieldargs (lua_State *L, int farg, int *width) {
  lua_Integer f = luaL_checkinteger(L, farg);
  lua_Integer w = luaL_optinteger(L, farg + 1, 1);
  luaL_argcheck(L, 0 <= f, farg, "field cannot be negative");
  luaL_argcheck(L, 0 < w, farg + 1, "width must be positive");
  if (f + w > LUA_NBITS)
    luaL_error(L, "trying to access non-existent bits");
  *width = (int)w;
  return (int)f;
}